

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-input.c
# Opt level: O0

_Bool textui_get_rep_dir(int *dp,_Bool allow_5)

{
  loc from_00;
  unkuint9 Var1;
  wchar_t wVar2;
  loc to_00;
  uint8_t uVar5;
  bool bVar3;
  keypress ch;
  keypress ch_00;
  ui_event uVar4;
  ui_event_type local_c0;
  undefined1 local_a0;
  int local_94;
  wchar_t this_dir;
  wchar_t keypresses_handled;
  loc to;
  loc from;
  wchar_t x;
  wchar_t y;
  ui_event_type local_70;
  ui_event_type local_40;
  mouseclick local_2c;
  ui_event ke;
  wchar_t dir;
  _Bool allow_5_local;
  int *dp_local;
  undefined5 uVar6;
  
  ke.key.code = 0;
  *dp = 0;
  do {
    if (ke.key.code != 0) {
      prt("",L'\0',L'\0');
      *dp = ke.key.code;
      return true;
    }
    event_signal(EVENT_MESSAGE_FLUSH);
    inkey_scan = 0xffffffff;
    uVar4 = inkey_ex();
    local_40 = (ui_event_type)uVar4.key.mods;
    ke.type = local_40;
    inkey_scan = 0;
    local_2c.type = uVar4.type;
    if ((local_2c.type == EVT_NONE) ||
       ((bVar3 = local_2c.type == EVT_KBRD, local_2c = uVar4.mouse, bVar3 &&
        (Var1 = uVar4._0_9_, ch._9_3_ = 0, ch.type = (int)Var1,
        register0x0000003c = (int)(Var1 >> 0x20), register0x00000030 = (char)(Var1 >> 0x40),
        wVar2 = target_dir_allow(ch,allow_5), wVar2 == L'\0')))) {
      prt("Direction or <click> (Escape to cancel)? ",L'\0',L'\0');
      uVar4 = inkey_ex();
      local_2c = uVar4.mouse;
      local_70 = (ui_event_type)uVar4.key.mods;
      ke.type = local_70;
    }
    if (local_2c.type == EVT_MOUSE) {
      if (local_2c.button == '\x01') {
        from_00 = player->grid;
        to_00 = loc((int)((uint)local_2c.x - col_map[Term->sidebar_mode]) / (int)(uint)tile_width +
                    Term->offset_x,
                    (int)((uint)local_2c.y - row_top_map[Term->sidebar_mode]) /
                    (int)(uint)tile_height + Term->offset_y);
        ke.key.code = pathfind_direction_to(from_00,to_00);
      }
      else if (local_2c.button == '\x02') {
        prt("",L'\0',L'\0');
        return false;
      }
    }
    else if (local_2c.type == EVT_KBRD) {
      local_94 = 0;
      while( true ) {
        if (local_2c.type != EVT_KBRD || local_2c._4_4_ == 0) break;
        if (local_2c._4_4_ == 0xe000) {
          prt("",L'\0',L'\0');
          return false;
        }
        local_a0 = (undefined1)ke.type;
        ch_00.mods = local_a0;
        ch_00._0_8_ = local_2c;
        ch_00._9_3_ = 0;
        wVar2 = target_dir_allow(ch_00,allow_5);
        if (wVar2 != L'\0') {
          ke.key.code = dir_transitions[(int)ke.key.code][wVar2];
        }
        if (((player->opts).lazymove_delay == '\0') || (local_94 = local_94 + 1, 1 < local_94))
        break;
        inkey_scan = (uint32_t)(player->opts).lazymove_delay;
        uVar4 = inkey_ex();
        local_2c = uVar4.mouse;
        local_c0 = (ui_event_type)uVar4.key.mods;
        ke.type = local_c0;
      }
      if ((ke.key.code == 5) && (!allow_5)) {
        prt("",L'\0',L'\0');
        return false;
      }
    }
    if (ke.key.code == 0) {
      bell();
    }
  } while( true );
}

Assistant:

static bool textui_get_rep_dir(int *dp, bool allow_5)
{
	int dir = 0;

	ui_event ke;

	/* Initialize */
	(*dp) = 0;

	/* Get a direction */
	while (!dir) {
		/* Paranoia*/
		event_signal(EVENT_MESSAGE_FLUSH);

		/* Get first keypress - the first test is to avoid displaying the
		 * prompt for direction if there's already a keypress queued up
		 * and waiting - this just avoids a flickering prompt if there is
		 * a "lazy" movement delay. */
		inkey_scan = SCAN_INSTANT;
		ke = inkey_ex();
		inkey_scan = SCAN_OFF;

		if (ke.type == EVT_NONE ||
				(ke.type == EVT_KBRD
				&& !target_dir_allow(ke.key, allow_5))) {
			prt("Direction or <click> (Escape to cancel)? ", 0, 0);
			ke = inkey_ex();
		}

		/* Check mouse coordinates, or get keypresses until a dir is chosen */
		if (ke.type == EVT_MOUSE) {
			if (ke.mouse.button == 1) {
				int y = KEY_GRID_Y(ke);
				int x = KEY_GRID_X(ke);
				struct loc from = player->grid;
				struct loc to = loc(x, y);

				dir = pathfind_direction_to(from, to);
			} else if (ke.mouse.button == 2) {
				/* Clear the prompt */
				prt("", 0, 0);

				return (false);
			}
		} else if (ke.type == EVT_KBRD) {
			int keypresses_handled = 0;

			while (ke.type == EVT_KBRD && ke.key.code != 0) {
				int this_dir;

				if (ke.key.code == ESCAPE) {
					/* Clear the prompt */
					prt("", 0, 0);

					return (false);
				}

				/* XXX Ideally show and move the cursor here to indicate
				 the currently "Pending" direction. XXX */
				this_dir = target_dir_allow(ke.key, allow_5);

				if (this_dir)
					dir = dir_transitions[dir][this_dir];

				if (player->opts.lazymove_delay == 0 || ++keypresses_handled > 1)
					break;

				inkey_scan = player->opts.lazymove_delay;
				ke = inkey_ex();
			}

			/* 5 is equivalent to "escape" */
			if (dir == 5 && !allow_5) {
				/* Clear the prompt */
				prt("", 0, 0);

				return (false);
			}
		}

		/* Oops */
		if (!dir) bell();
	}

	/* Clear the prompt */
	prt("", 0, 0);

	/* Save direction */
	(*dp) = dir;

	/* Success */
	return (true);
}